

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.cc
# Opt level: O3

void __thiscall
CommmonTest_ComplInfo_Test::~CommmonTest_ComplInfo_Test(CommmonTest_ComplInfo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CommmonTest, ComplInfo) {
  using mp::ComplInfo;
  int flags[] = {
    0,
    ComplInfo::INF_LB,
    ComplInfo::INF_UB,
    ComplInfo::INF_LB | ComplInfo::INF_UB
  };
  EXPECT_NE(0, ComplInfo::INF_LB);
  EXPECT_NE(0, ComplInfo::INF_UB);
  EXPECT_NE(ComplInfo::INF_LB, ComplInfo::INF_UB);
  double inf = INFINITY;
  for (std::size_t i = 0, n = sizeof(flags) / sizeof(*flags); i < n; ++i) {
    int f = flags[i];
    ComplInfo info(f);
    EXPECT_EQ((f & ComplInfo::INF_LB) != 0 ? -inf : 0, info.con_lb());
    EXPECT_EQ((f & ComplInfo::INF_UB) != 0 ?  inf : 0, info.con_ub());
  }
  EXPECT_ASSERT(ComplInfo((ComplInfo::INF_LB | ComplInfo::INF_UB) + 1),
                "invalid complementarity flags");
}